

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

sexp_conflict
sexp_duplicate_file_descriptor_to_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  int iVar1;
  sexp_conflict psVar2;
  int __fd2;
  
  if (((ulong)arg0 & 3) == 0) {
    if (arg0->tag != 0x12) goto LAB_00103d64;
  }
  else if (((ulong)arg0 & 1) == 0) {
LAB_00103d64:
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,0x12);
    return psVar2;
  }
  if (((ulong)arg1 & 3) == 0) {
    if (arg1->tag == 0x12) goto LAB_00103d92;
  }
  else if (((ulong)arg1 & 1) != 0) {
LAB_00103d92:
    if ((((ulong)arg0 & 3) == 0) && (arg0->tag == 0x12)) {
      iVar1 = (int)(arg0->value).fileno.fd;
    }
    else {
      iVar1 = (int)((long)arg0 >> 1);
    }
    if ((((ulong)arg1 & 3) == 0) && (arg1->tag == 0x12)) {
      __fd2 = (int)(arg1->value).fileno.fd;
    }
    else {
      __fd2 = (int)((long)arg1 >> 1);
    }
    iVar1 = dup2(iVar1,__fd2);
    return (sexp_conflict)((ulong)(iVar1 == 0) << 8 | 0x3e);
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,0x12,arg1);
  return psVar2;
}

Assistant:

sexp sexp_duplicate_file_descriptor_to_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int err = 0;
  sexp res;
  if (! (sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg0);
  if (! (sexp_filenop(arg1) || sexp_fixnump(arg1)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg1);
  err = dup2((sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), (sexp_filenop(arg1) ? sexp_fileno_fd(arg1) : sexp_unbox_fixnum(arg1)));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}